

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float __thiscall
tcu::Texture1DArrayView::sampleCompare
          (Texture1DArrayView *this,Sampler *sampler,float ref,float s,float t,float lod)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  int y_;
  float fVar1;
  Vector<int,_2> local_30;
  float local_28;
  float local_24;
  float lod_local;
  float t_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  Texture1DArrayView *this_local;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  local_28 = lod;
  local_24 = t;
  lod_local = s;
  t_local = ref;
  _s_local = sampler;
  sampler_local = (Sampler *)this;
  y_ = selectLayer(this,t);
  Vector<int,_2>::Vector(&local_30,0,y_);
  fVar1 = sampleLevelArray1DCompare(levels,numLevels,sampler,ref,s,lod,&local_30);
  return fVar1;
}

Assistant:

float Texture1DArrayView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float lod) const
{
	return sampleLevelArray1DCompare(m_levels, m_numLevels, sampler, ref, s, lod, IVec2(0, selectLayer(t)));
}